

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erfunc.c
# Opt level: O0

double erf__(double x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double top;
  double bot;
  double ax;
  double x2;
  double t;
  double ret_val;
  double s [4];
  double r [5];
  double local_e8;
  double q [8];
  double p [8];
  double b [3];
  double local_48;
  double a [5];
  double c;
  double x_local;
  
  a[4] = 0.564189583547756;
  memset(&local_48,0,0x28);
  local_48 = 7.7105849500132e-05;
  a[0] = -0.00133733772997339;
  a[1] = 0.0323076579225834;
  a[2] = 0.0479137145607681;
  a[3] = 0.128379167095513;
  memcpy(q + 7,&DAT_001796e0,0x40);
  memcpy(&local_e8,&DAT_00179720,0x40);
  memset(s + 3,0,0x28);
  s[3] = 2.10144126479064;
  s[0] = 187.11481179959;
  s[1] = 99.0191814623914;
  s[2] = 18.0124575948747;
  dVar2 = ABS(x);
  if (0.5 < dVar2) {
    if (4.0 < dVar2) {
      if (dVar2 < 5.8) {
        dVar3 = x * x;
        dVar4 = 1.0 / dVar3;
        dVar4 = a[4] - ((((dVar4 * 2.10144126479064 + 26.2370141675169) * dVar4 + 21.3688200555087)
                         * dVar4 + 4.6580782871847) * dVar4 + 0.282094791773523) /
                       (dVar3 * ((((dVar4 * 94.153775055546 + 187.11481179959) * dVar4 +
                                  99.0191814623914) * dVar4 + 18.0124575948747) * dVar4 + 1.0));
        dVar3 = exp(-dVar3);
        t = -dVar3 * (dVar4 / dVar2) + 0.5 + 0.5;
        if (x < 0.0) {
          t = -t;
        }
        x_local = t;
      }
      else {
        iVar1 = -1;
        if (0.0 < x) {
          iVar1 = 1;
        }
        x_local = (double)iVar1;
      }
    }
    else {
      dVar3 = exp(-x * x);
      t = (0.5 - (dVar3 * (((((((q[7] * dVar2 + p[0]) * dVar2 + p[1]) * dVar2 + p[2]) * dVar2 + p[3]
                             ) * dVar2 + p[4]) * dVar2 + p[5]) * dVar2 + p[6])) /
                 (((((((local_e8 * dVar2 + q[0]) * dVar2 + q[1]) * dVar2 + q[2]) * dVar2 + q[3]) *
                    dVar2 + q[4]) * dVar2 + q[5]) * dVar2 + q[6])) + 0.5;
      if (x < 0.0) {
        t = -t;
      }
      x_local = t;
    }
  }
  else {
    dVar2 = x * x;
    x_local = x * (((((local_48 * dVar2 + a[0]) * dVar2 + a[1]) * dVar2 + a[2]) * dVar2 + a[3] + 1.0
                   ) / (((dVar2 * 0.00301048631703895 + 0.0538971687740286) * dVar2 +
                        0.375795757275549) * dVar2 + 1.0));
  }
  return x_local;
}

Assistant:

double erf__(double x)
{
/* -----------------------------------------------------------------------
 *             EVALUATION OF THE REAL ERROR FUNCTION
 * ----------------------------------------------------------------------- */

    /* Initialized data */

     double c = .564189583547756;
     double a[5] = { 7.7105849500132e-5,-.00133733772997339,
	    .0323076579225834,.0479137145607681,.128379167095513 };
     double b[3] = { .00301048631703895,.0538971687740286,
	    .375795757275549 };
     double p[8] = { -1.36864857382717e-7,.564195517478974,
	    7.21175825088309,43.1622272220567,152.98928504694,
	    339.320816734344,451.918953711873,300.459261020162 };
     double q[8] = { 1.,12.7827273196294,77.0001529352295,
	    277.585444743988,638.980264465631,931.35409485061,
	    790.950925327898,300.459260956983 };
     double r[5] = { 2.10144126479064,26.2370141675169,
	    21.3688200555087,4.6580782871847,.282094791773523 };
     double s[4] = { 94.153775055546,187.11481179959,
	    99.0191814623914,18.0124575948747 };

    /* System generated locals */
    double ret_val;

    /* Local variables */
    double t, x2, ax, bot, top;

    ax = fabs(x);
    if (ax <= 0.5) {
	t = x * x;
	top = (((a[0] * t + a[1]) * t + a[2]) * t + a[3]) * t + a[4] + 1.0;
	bot = ((b[0] * t + b[1]) * t + b[2]) * t + 1.0;

	return x * (top / bot);
    }
    /* else: ax > 0.5 */

    if (ax <= 4.) { /*  ax in (0.5, 4] */

	top = ((((((p[0] * ax + p[1]) * ax + p[2]) * ax + p[3]) * ax + p[4]) * ax
		+ p[5]) * ax + p[6]) * ax + p[7];
	bot = ((((((q[0] * ax + q[1]) * ax + q[2]) * ax + q[3]) * ax + q[4]) * ax
		+ q[5]) * ax + q[6]) * ax + q[7];
	ret_val = 0.5 - exp(-x * x) * top / bot + 0.5;
	if (x < 0.0) {
	    ret_val = -ret_val;
	}
	return ret_val;
    }

    /* else: ax > 4 */

    if (ax >= 5.8) {
	return x > 0 ? 1 : -1;
    }
    x2 = x * x;
    t = 1.0 / x2;
    top = (((r[0] * t + r[1]) * t + r[2]) * t + r[3]) * t + r[4];
    bot = (((s[0] * t + s[1]) * t + s[2]) * t + s[3]) * t + 1.0;
    t = (c - top / (x2 * bot)) / ax;
    ret_val = 0.5 - exp(-x2) * t + 0.5;
    if (x < 0.0) {
	ret_val = -ret_val;
    }
    return ret_val;

}